

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrppm.c
# Opt level: O3

void put_cmyk(j_decompress_ptr cinfo,djpeg_dest_ptr dinfo,JDIMENSION rows_supplied)

{
  byte bVar1;
  byte bVar2;
  JDIMENSION JVar3;
  JSAMPROW pJVar4;
  long lVar5;
  ppm_dest_ptr dest;
  _func_void_j_decompress_ptr_djpeg_dest_ptr *__ptr;
  double dVar6;
  
  __ptr = dinfo[1].start_output;
  JVar3 = cinfo->output_width;
  if (JVar3 != 0) {
    pJVar4 = *dinfo->buffer;
    lVar5 = 0;
    do {
      bVar1 = pJVar4[lVar5 * 4 + 1];
      dVar6 = (double)pJVar4[lVar5 * 4 + 3];
      bVar2 = pJVar4[lVar5 * 4 + 2];
      *__ptr = (_func_void_j_decompress_ptr_djpeg_dest_ptr)
               (char)(int)(((double)pJVar4[lVar5 * 4] * dVar6) / 255.0 + 0.5);
      __ptr[1] = SUB41((int)(((double)bVar1 * dVar6) / 255.0 + 0.5),0);
      __ptr[2] = SUB41((int)(((double)bVar2 * dVar6) / 255.0 + 0.5),0);
      lVar5 = lVar5 + 1;
      __ptr = __ptr + 3;
    } while (JVar3 != (JDIMENSION)lVar5);
    __ptr = dinfo[1].start_output;
  }
  fwrite(__ptr,1,(size_t)dinfo[1].finish_output,(FILE *)dinfo->output_file);
  return;
}

Assistant:

METHODDEF(void)
put_cmyk(j_decompress_ptr cinfo, djpeg_dest_ptr dinfo,
         JDIMENSION rows_supplied)
{
  ppm_dest_ptr dest = (ppm_dest_ptr)dinfo;
  register char *bufferptr;
  register JSAMPROW ptr;
  register JDIMENSION col;

  ptr = dest->pub.buffer[0];
  bufferptr = dest->iobuffer;
  for (col = cinfo->output_width; col > 0; col--) {
    JSAMPLE r, g, b, c = *ptr++, m = *ptr++, y = *ptr++, k = *ptr++;
    cmyk_to_rgb(c, m, y, k, &r, &g, &b);
    PUTPPMSAMPLE(bufferptr, r);
    PUTPPMSAMPLE(bufferptr, g);
    PUTPPMSAMPLE(bufferptr, b);
  }
  (void)JFWRITE(dest->pub.output_file, dest->iobuffer, dest->buffer_width);
}